

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanim.cpp
# Opt level: O2

void rw::registerHAnimPlugin(void)

{
  Engine::registerPlugin(0,0x11e,hanimOpen,hanimClose);
  hAnimOffset = Frame::registerPlugin(0x10,0x11e,createHAnim,destroyHAnim,copyHAnim);
  Frame::registerPluginStream(0x11e,readHAnim,writeHAnim,getSizeHAnim);
  return;
}

Assistant:

void
registerHAnimPlugin(void)
{
	Engine::registerPlugin(0, ID_HANIM, hanimOpen, hanimClose);
	hAnimOffset = Frame::registerPlugin(sizeof(HAnimData), ID_HANIM,
	                                    createHAnim,
	                                    destroyHAnim, copyHAnim);
	Frame::registerPluginStream(ID_HANIM,
	                            readHAnim,
	                            writeHAnim,
	                            getSizeHAnim);
}